

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O2

uint32_t FAudio_INTERNAL_VoiceOutputFrequency(FAudioVoice *voice,FAudioVoiceSends *pSendList)

{
  FAudioVoice *pFVar1;
  FAudioMasteringVoice *pFVar2;
  FAudioMasteringVoice *pFVar3;
  uint32_t uVar4;
  ulong uVar5;
  FAudio *pFVar6;
  uint32_t uVar7;
  double dVar8;
  double dVar9;
  
  if ((pSendList == (FAudioVoiceSends *)0x0) || (pSendList->SendCount == 0)) {
    pFVar6 = voice->audio;
    pFVar3 = pFVar6->master;
    pFVar2 = pFVar3;
  }
  else {
    pFVar1 = pSendList->pSends->pOutputVoice;
    pFVar6 = voice->audio;
    pFVar3 = pFVar6->master;
    pFVar2 = (FAudioMasteringVoice *)
             (&pFVar1->audio + (ulong)(pFVar1->type != FAUDIO_VOICE_MASTER) * 2);
  }
  dVar9 = (double)(pFVar2->field_19).master.inputSampleRate;
  dVar8 = (double)SDL_ceil(((double)pFVar6->updateSize * dVar9) /
                           (double)(pFVar3->field_19).master.inputSampleRate);
  uVar7 = (uint32_t)(long)dVar8;
  if (voice->type == FAUDIO_VOICE_SOURCE) {
    uVar4 = (voice->field_19).src.resampleSamples;
    if (((uVar4 == 0) || (uVar4 == uVar7)) || (uVar4 = 0x88960001, (voice->effects).count == 0)) {
      (voice->field_19).src.resampleSamples = uVar7;
      uVar4 = 0;
    }
  }
  else {
    uVar4 = (voice->field_19).src.resampleSamples;
    if (((uVar4 == 0) || (uVar4 == uVar7)) || (uVar4 = 0x88960001, (voice->effects).count == 0)) {
      (voice->field_19).src.resampleSamples = uVar7;
      dVar9 = ((double)(voice->field_19).mix.inputSampleRate / dVar9) * 4294967296.0 + 0.5;
      uVar5 = (ulong)dVar9;
      uVar5 = (long)(dVar9 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
      (voice->field_19).src.resampleStep = uVar5;
      uVar4 = 0;
      if ((voice->field_19).src.decodeSamples / (voice->field_19).mix.inputChannels <
          (uint)(((long)dVar8 & 0xffffffffU) * uVar5 >> 0x20)) {
        (voice->field_19).src.resampleSamples = uVar7 - 1;
      }
    }
  }
  return uVar4;
}

Assistant:

uint32_t FAudio_INTERNAL_VoiceOutputFrequency(
	FAudioVoice *voice,
	const FAudioVoiceSends *pSendList
) {
	uint32_t outSampleRate;
	uint32_t newResampleSamples;
	uint64_t resampleSanityCheck;

	LOG_FUNC_ENTER(voice->audio)

	if ((pSendList == NULL) || (pSendList->SendCount == 0))
	{
		/* When we're deliberately given no sends, use master rate! */
		outSampleRate = voice->audio->master->master.inputSampleRate;
	}
	else
	{
		outSampleRate = pSendList->pSends[0].pOutputVoice->type == FAUDIO_VOICE_MASTER ?
			pSendList->pSends[0].pOutputVoice->master.inputSampleRate :
			pSendList->pSends[0].pOutputVoice->mix.inputSampleRate;
	}
	newResampleSamples = (uint32_t) FAudio_ceil(
		voice->audio->updateSize *
		(double) outSampleRate /
		(double) voice->audio->master->master.inputSampleRate
	);
	if (voice->type == FAUDIO_VOICE_SOURCE)
	{
		if (	(voice->src.resampleSamples != 0) &&
			(newResampleSamples != voice->src.resampleSamples) &&
			(voice->effects.count > 0)	)
		{
			LOG_FUNC_EXIT(voice->audio)
			return FAUDIO_E_INVALID_CALL;
		}
		voice->src.resampleSamples = newResampleSamples;
	}
	else /* (voice->type == FAUDIO_VOICE_SUBMIX) */
	{
		if (	(voice->mix.outputSamples != 0) &&
			(newResampleSamples != voice->mix.outputSamples) &&
			(voice->effects.count > 0)	)
		{
			LOG_FUNC_EXIT(voice->audio)
			return FAUDIO_E_INVALID_CALL;
		}
		voice->mix.outputSamples = newResampleSamples;

		voice->mix.resampleStep = DOUBLE_TO_FIXED((
			(double) voice->mix.inputSampleRate /
			(double) outSampleRate
		));

		/* Because we used ceil earlier, there's a chance that
		 * downsampling submixes will go past the number of samples
		 * available. Sources can do this thanks to padding, but we
		 * don't have that luxury for submixes, so unfortunately we
		 * just have to undo the ceil and turn it into a floor.
		 * -flibit
		 */
		resampleSanityCheck = (
			voice->mix.resampleStep * voice->mix.outputSamples
		) >> FIXED_PRECISION;
		if (resampleSanityCheck > (voice->mix.inputSamples / voice->mix.inputChannels))
		{
			voice->mix.outputSamples -= 1;
		}
	}

	LOG_FUNC_EXIT(voice->audio)
	return 0;
}